

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_16x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  undefined1 in_CL;
  int col_num;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i out [64];
  __m128i in [64];
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 uVar3;
  longlong local_828 [100];
  int in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  __m128i *in_stack_fffffffffffffb00;
  __m128i *in_stack_fffffffffffffb08;
  __m128i *in_stack_fffffffffffffb20;
  __m128i *in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  int in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbe4;
  __m128i *in_stack_fffffffffffffbe8;
  int16_t *in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  __m128i *in_stack_fffffffffffffc50;
  __m128i *in_stack_fffffffffffffc58;
  
  uVar3 = 2;
  iVar1 = get_txw_idx('\x02');
  iVar2 = get_txh_idx((TX_SIZE)uVar3);
  switch(in_CL) {
  case 0:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 1:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 2:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 3:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 4:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 5:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 6:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 7:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 8:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 9:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_col[iVar1][iVar2],4);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_row[iVar1][iVar2],4);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 10:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_row[iVar1][iVar2],4);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 0xb:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_col[iVar1][iVar2],4);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fdct16x16_sse4_1(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,
                     in_stack_fffffffffffffaf8);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 0xc:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_row[iVar1][iVar2],4);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 0xd:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_col[iVar1][iVar2],4);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 0xe:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_row[iVar1][iVar2],4);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    break;
  case 0xf:
    load_buffer_16x16(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
                      in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)
    ;
    idtx16x16_sse4_1((__m128i *)&stack0xfffffffffffffbd8,(__m128i *)local_828,
                     (int)av1_fwd_cos_bit_col[iVar1][iVar2],4);
    col_txfm_16x16_rounding
              ((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),in_stack_fffffffffffff7ac);
    transpose_16x16(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    fadst16x16_sse4_1(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                      in_stack_fffffffffffffc48);
    write_buffer_16x16((__m128i *)CONCAT44(uVar3,in_stack_fffffffffffff7b0),
                       (int32_t *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x16_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64], out[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X16];
  const int txw_idx = get_txw_idx(TX_16X16);
  const int txh_idx = get_txh_idx(TX_16X16);
  const int col_num = 4;
  switch (tx_type) {
    case DCT_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_16x16(input, in, stride, 1, 1, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case IDTX:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_DCT:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fdct16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_ADST:
      load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_16x16(input, in, stride, 1, 0, shift[0]);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx],
                        col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], col_num);
      write_buffer_16x16(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_16x16(input, in, stride, 0, 1, shift[0]);
      idtx16x16_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], col_num);
      col_txfm_16x16_rounding(out, -shift[1]);
      transpose_16x16(out, in);
      fadst16x16_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx],
                        col_num);
      write_buffer_16x16(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}